

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_Prepare(Ifn_Ntk_t *p,word *pTruth,int nVars)

{
  int iVar1;
  int local_20;
  int fVerbose;
  int i;
  int nVars_local;
  word *pTruth_local;
  Ifn_Ntk_t *p_local;
  
  if (p->nInps < nVars) {
    __assert_fail("nVars <= p->nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x76,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
  }
  p->pTruth = pTruth;
  p->nVars = nVars;
  iVar1 = Abc_TtWordNum(nVars);
  p->nWords = iVar1;
  p->nPars = p->nObjs;
  for (local_20 = p->nInps; local_20 < p->nObjs; local_20 = local_20 + 1) {
    if (((undefined1  [48])p->Nodes[local_20] & (undefined1  [48])0x7) == (undefined1  [48])0x6) {
      *(uint *)(p->Nodes + local_20) =
           *(uint *)(p->Nodes + local_20) & 0xffff00ff | (p->nPars & 0xffU) << 8;
      p->nPars = (1 << ((byte)(*(uint *)(p->Nodes + local_20) >> 3) & 0x1f)) + p->nPars;
    }
  }
  p->nParsVIni = p->nPars;
  iVar1 = Abc_Base2Log(nVars);
  p->nParsVNum = iVar1;
  p->nPars = p->nParsVNum * p->nInps + p->nPars;
  if (p->nPars < 0x401) {
    memset(p->Values,0xff,(long)p->nPars << 2);
    return p->nPars;
  }
  __assert_fail("p->nPars <= IFN_PAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x89,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
}

Assistant:

int Ifn_Prepare( Ifn_Ntk_t * p, word * pTruth, int nVars )
{
    int i, fVerbose = 0;
    assert( nVars <= p->nInps );
    p->pTruth = pTruth;
    p->nVars  = nVars;
    p->nWords = Abc_TtWordNum(nVars);
    p->nPars  = p->nObjs;
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        if ( p->Nodes[i].Type != IFN_DSD_PRIME )
            continue;
        p->Nodes[i].iFirst = p->nPars;
        p->nPars += (1 << p->Nodes[i].nFanins);
        if ( fVerbose )
            printf( "Node %d  Start %d  Vars %d\n", i, p->Nodes[i].iFirst, (1 << p->Nodes[i].nFanins) );
    }
    if ( fVerbose )
        printf( "Groups start %d\n", p->nPars );
    p->nParsVIni = p->nPars;
    p->nParsVNum = Abc_Base2Log(nVars);
    p->nPars    += p->nParsVNum * p->nInps;
    assert( p->nPars <= IFN_PAR );
    memset( p->Values, 0xFF, sizeof(int) * p->nPars );
    return p->nPars;
}